

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  bool bVar174;
  int iVar175;
  uint uVar176;
  int extraout_EAX;
  ulong uVar177;
  ulong uVar178;
  secp256k1_fe *psVar179;
  secp256k1_fe *psVar180;
  long lVar181;
  byte bVar182;
  int iVar183;
  ulong uVar184;
  ulong uVar185;
  ulong uVar186;
  secp256k1_fe *psVar187;
  ulong uVar188;
  secp256k1_fe *psVar189;
  int iVar190;
  secp256k1_fe *psVar191;
  secp256k1_fe *psVar192;
  secp256k1_fe *a;
  ulong uVar193;
  uint64_t *puVar194;
  secp256k1_fe *psVar195;
  uint64_t *puVar196;
  secp256k1_fe *psVar197;
  int iVar198;
  secp256k1_fe *psVar199;
  secp256k1_fe *unaff_R12;
  ulong unaff_R13;
  secp256k1_fe *psVar200;
  secp256k1_fe *psVar201;
  secp256k1_fe *psVar202;
  bool bVar203;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe t;
  uchar auStack_328 [40];
  secp256k1_fe *psStack_300;
  secp256k1_fe *psStack_2f8;
  ulong uStack_2f0;
  secp256k1_fe *psStack_2e8;
  secp256k1_fe *psStack_2e0;
  secp256k1_fe *psStack_2d8;
  secp256k1_fe *psStack_2c8;
  ulong uStack_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  secp256k1_fe sStack_2a8;
  secp256k1_fe *psStack_278;
  secp256k1_fe *psStack_270;
  ulong uStack_268;
  secp256k1_fe *psStack_260;
  secp256k1_fe *psStack_258;
  secp256k1_fe *psStack_250;
  undefined8 uStack_240;
  undefined1 auStack_238 [48];
  ulong uStack_208;
  secp256k1_fe *psStack_200;
  undefined1 auStack_1f8 [40];
  secp256k1_modinv64_trans2x2 sStack_1d0;
  secp256k1_fe *psStack_1b0;
  secp256k1_fe *psStack_1a8;
  ulong uStack_1a0;
  secp256k1_fe *psStack_198;
  secp256k1_fe *psStack_190;
  secp256k1_fe *psStack_188;
  secp256k1_fe sStack_180;
  secp256k1_fe sStack_150;
  secp256k1_modinv64_signed62 sStack_120;
  secp256k1_fe sStack_f8;
  secp256k1_fe *psStack_c8;
  secp256k1_fe *psStack_c0;
  ulong local_b0;
  secp256k1_fe *local_a8;
  ulong local_a0;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  psVar200 = (secp256k1_fe *)0xfffffffffffff;
  psVar202 = (secp256k1_fe *)0x1000003d0;
  psStack_c0 = (secp256k1_fe *)0x152a36;
  secp256k1_fe_verify(xd);
  uVar177 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar177 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar177 & 0xfffffffffffff) == 0)) {
    uVar184 = (uVar177 >> 0x34) + xd->n[1];
    psVar191 = (secp256k1_fe *)((uVar184 >> 0x34) + xd->n[2]);
    psVar192 = (secp256k1_fe *)(((ulong)psVar191 >> 0x34) + xd->n[3]);
    uVar193 = ((ulong)psVar192 >> 0x34) + (xd->n[4] & 0xffffffffffff);
    if ((((uVar184 | uVar177 | (ulong)psVar191 | (ulong)psVar192) & 0xfffffffffffff) == 0 &&
         uVar193 == 0) ||
       (((uVar177 | 0x1000003d0) & uVar184 & (ulong)psVar191 & (ulong)psVar192 &
        (uVar193 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_0015330c;
  }
  psStack_c0 = (secp256k1_fe *)0x152aec;
  psVar191 = xd;
  secp256k1_fe_mul(&local_68,xd,xn);
  psStack_c0 = (secp256k1_fe *)0x152af4;
  psVar192 = xn;
  secp256k1_fe_verify(xn);
  if (xn->magnitude < 9) {
    psVar200 = &local_98;
    uVar177 = xn->n[0];
    uVar184 = xn->n[1];
    unaff_R12 = (secp256k1_fe *)xn->n[2];
    unaff_R13 = xn->n[3];
    uVar193 = xn->n[4];
    psVar202 = (secp256k1_fe *)0xfffffffffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar177 * 2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = unaff_R13;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar184 * 2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = unaff_R12;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar193;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar193;
    uVar178 = SUB168(auVar4 * auVar84,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    local_a0 = uVar185 & 0xfffffffffffff;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar193 = uVar193 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar177;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar193;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar184 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = unaff_R13;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_R12;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = unaff_R12;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar178 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
    auVar2 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar178 & 0xfffffffffffff) >> 0x30;
    local_a8 = (secp256k1_fe *)(uVar178 & 0xffffffffffff);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar177;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar177;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar184;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar193;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (long)unaff_R12 * 2;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = unaff_R13;
    auVar2 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
    uVar178 = auVar2._0_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
    uVar178 = auVar2._0_8_;
    local_98.n[0] = uVar178 & 0xfffffffffffff;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar177 * 2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar184;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R12;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar193;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_R13;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = unaff_R13;
    auVar3 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
    uVar178 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar178 >> 0x34 | auVar3._8_8_ << 0xc;
    local_98.n[1] = uVar185 & 0xfffffffffffff;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar177 * 2;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = unaff_R12;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar184;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar184;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = unaff_R13;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar193;
    auVar151 = auVar19 * auVar97 + auVar151;
    uVar177 = auVar151._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar177 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
    uVar184 = auVar2._0_8_;
    local_98.n[2] = uVar184 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = (uVar184 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar177 >> 0x34 | auVar151._8_8_ << 0xc;
    auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
    uVar177 = auVar152._0_8_;
    local_98.n[3] = uVar177 & 0xfffffffffffff;
    local_98.n[4] = (long)local_a8->n + (uVar177 >> 0x34 | auVar152._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_fe *)0x152d3e;
    secp256k1_fe_verify(psVar200);
    psVar191 = &local_68;
    psStack_c0 = (secp256k1_fe *)0x152d4e;
    secp256k1_fe_mul(psVar191,psVar191,psVar200);
    psStack_c0 = (secp256k1_fe *)0x152d56;
    psVar192 = xd;
    secp256k1_fe_verify(xd);
    xn = xd;
    if (8 < xd->magnitude) goto LAB_001532f8;
    uVar184 = xd->n[0];
    uVar193 = xd->n[1];
    psVar187 = (secp256k1_fe *)xd->n[2];
    uVar177 = xd->n[3];
    uVar178 = xd->n[4];
    psVar202 = (secp256k1_fe *)0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar184 * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar177;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar193 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = psVar187;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar178;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar178;
    uVar185 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar185 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar186 = auVar2._0_8_;
    local_a0 = uVar186 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
    psVar200 = (secp256k1_fe *)(uVar178 * 2);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar184;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = psVar200;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar193 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar177;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = psVar187;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = psVar187;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar185 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar2 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
             auVar29 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar178 & 0xfffffffffffff) >> 0x30;
    psVar191 = (secp256k1_fe *)(uVar178 & 0xffffffffffff);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar184;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar184;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar193;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = psVar200;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (long)psVar187 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar177;
    auVar2 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar178 = auVar2._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar178 = auVar2._0_8_;
    local_98.n[0] = uVar178 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar184 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar193;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = psVar187;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = psVar200;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar177;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar177;
    auVar3 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar178 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar178 >> 0x34 | auVar3._8_8_ << 0xc;
    local_98.n[1] = uVar185 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar184 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = psVar187;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar193;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar193;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar177;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = psVar200;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar184 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar184 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar193 = auVar2._0_8_;
    xn = (secp256k1_fe *)(uVar184 >> 0x34 | auVar158._8_8_ << 0xc);
    local_98.n[2] = uVar193 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = (uVar193 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = xn;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar184 = auVar159._0_8_;
    local_98.n[3] = uVar184 & 0xfffffffffffff;
    local_98.n[4] = (long)psVar191->n + (uVar184 >> 0x34 | auVar159._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_fe *)0x152f9d;
    local_a8 = psVar191;
    secp256k1_fe_verify(&local_98);
    psStack_c0 = (secp256k1_fe *)0x152fa5;
    psVar192 = &local_98;
    secp256k1_fe_verify(&local_98);
    unaff_R13 = local_98.n[3];
    unaff_R12 = (secp256k1_fe *)local_98.n[2];
    xd = &local_98;
    if (8 < local_98.magnitude) goto LAB_001532fd;
    psVar202 = (secp256k1_fe *)0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_98.n[0] * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_98.n[3];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_98.n[1] * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_98.n[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_98.n[4];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_98.n[4];
    uVar177 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar177 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar184 = auVar2._0_8_;
    local_a0 = uVar184 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar184 >> 0x34 | auVar2._8_8_ << 0xc;
    psVar200 = (secp256k1_fe *)(local_98.n[4] * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_98.n[0];
    auVar117._8_8_ = 0;
    auVar117._0_8_ = psVar200;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_98.n[1] * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_98.n[3];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_98.n[2];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_98.n[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar177 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar2 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar177 = auVar2._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar177 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar177 & 0xfffffffffffff) >> 0x30;
    psVar191 = (secp256k1_fe *)(uVar177 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_98.n[0];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = local_98.n[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_98.n[1];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = psVar200;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_98.n[2] * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_98.n[3];
    auVar2 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar177 = auVar2._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar177 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar177 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar184 = auVar2._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar184 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_98.n[0] * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_98.n[1];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_98.n[2];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = psVar200;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_98.n[3];
    auVar126._8_8_ = 0;
    auVar126._0_8_ = local_98.n[3];
    auVar3 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar177 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar177 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar193 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar177 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar193 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_98.n[0] * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_98.n[2];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_98.n[1];
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_98.n[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_98.n[3];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = psVar200;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar177 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar177 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    xn = (secp256k1_fe *)(uVar177 >> 0x34 | auVar165._8_8_ << 0xc);
    local_98.n[2] = uVar178 & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar178 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = xn;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar177 = auVar166._0_8_;
    local_98.n[3] = uVar177 & 0xfffffffffffff;
    local_98.n[4] = (long)psVar191->n + (uVar177 >> 0x34 | auVar166._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_fe *)0x1531e8;
    local_a8 = psVar191;
    local_98.n[0] = (uint64_t)(uVar184 & 0xfffffffffffff);
    local_98.n[1] = uVar193 & 0xfffffffffffff;
    secp256k1_fe_verify(&local_98);
    psStack_c0 = (secp256k1_fe *)0x1531f0;
    psVar192 = &local_98;
    secp256k1_fe_verify(&local_98);
    if (4 < local_98.magnitude) goto LAB_00153302;
    xn = &local_98;
    psVar191 = (secp256k1_fe *)(local_98.n[0] * 7);
    local_98.n[1] = local_98.n[1] * 7;
    local_98.n[2] = local_98.n[2] * 7;
    local_98.n[3] = local_98.n[3] * 7;
    local_98.n[4] = local_98.n[4] * 7;
    local_98.normalized = 0;
    local_98.magnitude = local_98.magnitude * 7;
    psStack_c0 = (secp256k1_fe *)0x15327a;
    local_98.n[0] = (uint64_t)psVar191;
    secp256k1_fe_verify(xn);
    psVar200 = &local_68;
    psStack_c0 = (secp256k1_fe *)0x153287;
    secp256k1_fe_verify(psVar200);
    psStack_c0 = (secp256k1_fe *)0x15328f;
    psVar192 = xn;
    secp256k1_fe_verify(xn);
    local_68.magnitude = local_98.magnitude + local_68.magnitude;
    if (local_68.magnitude < 0x21) {
      local_68.n[0] = (long)(uint64_t *)local_98.n[0] + local_68.n[0];
      local_68.n[1] = local_68.n[1] + local_98.n[1];
      local_68.n[2] = (long)(uint64_t *)local_98.n[2] + local_68.n[2];
      local_68.n[3] = local_68.n[3] + local_98.n[3];
      local_68.n[4] = local_68.n[4] + local_98.n[4];
      local_68.normalized = 0;
      psStack_c0 = (secp256k1_fe *)0x1532d9;
      secp256k1_fe_verify(&local_68);
      psStack_c0 = (secp256k1_fe *)0x1532e1;
      iVar175 = secp256k1_fe_is_square_var(&local_68);
      return iVar175;
    }
  }
  else {
    psStack_c0 = (secp256k1_fe *)0x1532f8;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_001532f8:
    psStack_c0 = (secp256k1_fe *)0x1532fd;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
    psVar187 = unaff_R12;
    uVar177 = unaff_R13;
LAB_001532fd:
    unaff_R13 = uVar177;
    unaff_R12 = psVar187;
    psStack_c0 = (secp256k1_fe *)0x153302;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00153302:
    psStack_c0 = (secp256k1_fe *)0x153307;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  psStack_c0 = (secp256k1_fe *)0x15330c;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
LAB_0015330c:
  psStack_c0 = (secp256k1_fe *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_c0 = psVar200;
  psStack_c8 = xn;
  a = &sStack_180;
  psVar201 = &sStack_180;
  psVar187 = &sStack_180;
  sStack_150.n[0] = psVar192->n[0];
  sStack_150.n[1] = psVar192->n[1];
  sStack_150.n[2] = psVar192->n[2];
  sStack_150.n[3] = psVar192->n[3];
  sStack_150.n[4] = psVar192->n[4];
  sStack_150.magnitude = psVar192->magnitude;
  sStack_150.normalized = psVar192->normalized;
  psStack_188 = (secp256k1_fe *)0x15333d;
  secp256k1_fe_verify(psVar192);
  sStack_180.n[0] = psVar192->n[0];
  sStack_180.n[1] = psVar192->n[1];
  sStack_180.n[2] = psVar192->n[2];
  sStack_180.n[3] = psVar192->n[3];
  sStack_180.n[4] = psVar192->n[4];
  sStack_180.magnitude = psVar192->magnitude;
  sStack_180.normalized = psVar192->normalized;
  psStack_188 = (secp256k1_fe *)0x15335e;
  secp256k1_fe_normalize_var(&sStack_180);
  psStack_188 = (secp256k1_fe *)0x153366;
  secp256k1_fe_verify(&sStack_180);
  if (sStack_180.normalized == 0) {
    psStack_188 = (secp256k1_fe *)0x1534ff;
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((sStack_180.n[2] == 0 && sStack_180.n[3] == 0) &&
        (sStack_180.n[1] == 0 && sStack_180.n[0] == 0)) && sStack_180.n[4] == 0) {
      psVar187 = (secp256k1_fe *)0x1;
    }
    else {
      sStack_120.v[0] = (sStack_180.n[1] << 0x34 | sStack_180.n[0]) & 0x3fffffffffffffff;
      sStack_120.v[1] = (ulong)((uint)sStack_180.n[2] & 0xfffff) << 0x2a | sStack_180.n[1] >> 10;
      sStack_120.v[2] =
           (ulong)((uint)sStack_180.n[3] & 0x3fffffff) << 0x20 | sStack_180.n[2] >> 0x14;
      sStack_120.v[3] = (sStack_180.n[4] & 0xffffffffff) << 0x16 | sStack_180.n[3] >> 0x1e;
      sStack_120.v[4] = sStack_180.n[4] >> 0x28;
      psStack_188 = (secp256k1_fe *)0x153421;
      uVar176 = secp256k1_jacobi64_maybe_var(&sStack_120,&secp256k1_const_modinfo_fe);
      if (uVar176 == 0) {
        psStack_188 = (secp256k1_fe *)0x153445;
        uVar176 = secp256k1_fe_sqrt(&sStack_f8,&sStack_180);
        psVar187 = (secp256k1_fe *)(ulong)uVar176;
      }
      else {
        psVar187 = (secp256k1_fe *)(ulong)(~uVar176 >> 0x1f);
      }
    }
    psVar200 = &sStack_150;
    psStack_188 = (secp256k1_fe *)0x153454;
    secp256k1_fe_verify(psVar200);
    sStack_150.n[0] = (sStack_150.n[4] >> 0x30) * 0x1000003d1 + sStack_150.n[0];
    sStack_150.n[1] = (sStack_150.n[0] >> 0x34) + sStack_150.n[1];
    sStack_150.n[2] = (sStack_150.n[1] >> 0x34) + sStack_150.n[2];
    uVar177 = (sStack_150.n[2] >> 0x34) + sStack_150.n[3];
    sStack_150.n[3] = uVar177 & 0xfffffffffffff;
    sStack_150.n[4] = (uVar177 >> 0x34) + (sStack_150.n[4] & 0xffffffffffff);
    sStack_150.n[2] = sStack_150.n[2] & 0xfffffffffffff;
    sStack_150.n[1] = sStack_150.n[1] & 0xfffffffffffff;
    sStack_150.n[0] = sStack_150.n[0] & 0xfffffffffffff;
    sStack_150.magnitude = 1;
    psStack_188 = (secp256k1_fe *)0x1534de;
    secp256k1_fe_verify(psVar200);
    psStack_188 = (secp256k1_fe *)0x1534e9;
    psVar191 = psVar200;
    iVar175 = secp256k1_fe_sqrt(&sStack_180,psVar200);
    a = psVar201;
    if ((int)psVar187 == iVar175) {
      return (int)psVar187;
    }
  }
  psStack_188 = (secp256k1_fe *)secp256k1_jacobi64_maybe_var;
  secp256k1_fe_is_square_var_cold_1();
  psStack_188 = xd;
  psStack_190 = psVar202;
  psStack_198 = psVar200;
  uStack_1a0 = unaff_R13;
  psStack_1a8 = unaff_R12;
  psStack_1b0 = psVar187;
  auStack_1f8._32_8_ = psVar191->n[4];
  auStack_1f8._16_8_ = psVar191->n[2];
  auStack_1f8._24_8_ = psVar191->n[3];
  auStack_1f8._0_8_ = psVar191->n[0];
  auStack_1f8._8_8_ = psVar191->n[1];
  auStack_238._0_8_ = a->n[0];
  auStack_238._8_8_ = a->n[1];
  auStack_238._16_8_ = a->n[2];
  auStack_238._24_8_ = a->n[3];
  auStack_238._32_8_ = a->n[4];
  if (((((long)auStack_238._0_8_ < 0) || ((long)auStack_238._8_8_ < 0)) ||
      (psVar187 = psVar191, (long)auStack_238._16_8_ < 0)) ||
     ((a = (secp256k1_fe *)auStack_238._24_8_, (long)auStack_238._24_8_ < 0 ||
      ((long)auStack_238._32_8_ < 0)))) {
LAB_00153987:
    psStack_250 = (secp256k1_fe *)0x15398c;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_0015398c:
    psStack_250 = (secp256k1_fe *)0x153991;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00153991:
    psStack_250 = (secp256k1_fe *)0x153996;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00153996:
    psStack_250 = (secp256k1_fe *)0x15399b;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_0015399b:
    psStack_250 = (secp256k1_fe *)0x1539a0;
    secp256k1_jacobi64_maybe_var_cold_8();
    psVar191 = psVar187;
    psVar192 = unaff_R12;
    psVar201 = psVar200;
  }
  else {
    psVar192 = unaff_R12;
    psVar201 = psVar200;
    if (((auStack_238._16_8_ != 0 || (secp256k1_fe *)auStack_238._24_8_ != (secp256k1_fe *)0x0) ||
        (auStack_238._8_8_ != 0 || auStack_238._0_8_ != 0)) || auStack_238._32_8_ != 0) {
      psVar200 = (secp256k1_fe *)0x5;
      unaff_R13 = 0xffffffffffffffff;
      uStack_208 = 0;
      xd = (secp256k1_fe *)0x0;
      auStack_238._40_8_ = psVar191;
      do {
        psVar187 = (secp256k1_fe *)auStack_238._40_8_;
        a = (secp256k1_fe *)(auStack_1f8._8_8_ << 0x3e | auStack_1f8._0_8_);
        puVar194 = (uint64_t *)(auStack_238._8_8_ << 0x3e | auStack_238._0_8_);
        psVar179 = (secp256k1_fe *)0x0;
        psVar195 = (secp256k1_fe *)0x0;
        psVar192 = (secp256k1_fe *)0x1;
        iVar175 = 0x3e;
        psVar201 = (secp256k1_fe *)0x1;
        puVar196 = puVar194;
        psVar199 = a;
        while( true ) {
          uVar177 = -1L << ((byte)iVar175 & 0x3f) | (ulong)puVar196;
          lVar181 = 0;
          if (uVar177 != 0) {
            for (; (uVar177 >> lVar181 & 1) == 0; lVar181 = lVar181 + 1) {
            }
          }
          bVar182 = (byte)lVar181;
          psVar197 = (secp256k1_fe *)((ulong)puVar196 >> (bVar182 & 0x3f));
          psVar201 = (secp256k1_fe *)((long)psVar201 << (bVar182 & 0x3f));
          psVar179 = (secp256k1_fe *)((long)psVar179 << (bVar182 & 0x3f));
          unaff_R13 = unaff_R13 - lVar181;
          uVar176 = ((uint)((ulong)psVar199 >> 1) ^ (uint)((ulong)psVar199 >> 2)) & (uint)lVar181 ^
                    (uint)xd;
          psVar202 = (secp256k1_fe *)(ulong)uVar176;
          iVar175 = iVar175 - (uint)lVar181;
          psStack_200 = psVar200;
          if (iVar175 == 0) break;
          if (((ulong)psVar199 & 1) == 0) {
            psStack_250 = (secp256k1_fe *)0x153955;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00153955:
            psStack_250 = (secp256k1_fe *)0x15395a;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_0015395a:
            psStack_250 = (secp256k1_fe *)0x15395f;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_0015395f:
            psStack_250 = (secp256k1_fe *)0x153964;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00153964;
          }
          if (((ulong)psVar197 & 1) == 0) goto LAB_00153955;
          bVar182 = 0x3e - (char)iVar175;
          psVar191 = (secp256k1_fe *)((long)psVar199 << (bVar182 & 0x3f));
          if ((secp256k1_fe *)((long)psVar179 * (long)puVar194 + (long)psVar201 * (long)a) !=
              psVar191) goto LAB_0015395a;
          psVar191 = (secp256k1_fe *)((long)psVar192 * (long)puVar194 + (long)psVar195 * (long)a);
          if (psVar191 != (secp256k1_fe *)((long)psVar197 << (bVar182 & 0x3f))) goto LAB_0015395f;
          iVar198 = (int)psVar199;
          iVar190 = (int)psVar197;
          if ((long)unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar183 = (int)unaff_R13 + 1;
            if (iVar175 <= iVar183) {
              iVar183 = iVar175;
            }
            if (0xffffffc1 < iVar183 - 0x3fU) {
              xd = (secp256k1_fe *)
                   (ulong)(uVar176 ^ (uint)(((ulong)psVar197 & (ulong)psVar199) >> 1));
              psVar191 = (secp256k1_fe *)
                         ((ulong)(0x3fL << (-(char)iVar183 & 0x3fU)) >> (-(char)iVar183 & 0x3fU));
              uVar176 = (iVar190 * iVar190 + 0x3e) * iVar190 * iVar198 & (uint)psVar191;
              psVar180 = psVar179;
              psVar179 = psVar192;
              psVar189 = psVar197;
              psVar192 = psVar201;
              psVar201 = psVar195;
              goto LAB_0015373f;
            }
            goto LAB_0015396e;
          }
          iVar183 = (int)unaff_R13 + 1;
          if (iVar175 <= iVar183) {
            iVar183 = iVar175;
          }
          if (iVar183 - 0x3fU < 0xffffffc2) goto LAB_00153969;
          psVar191 = (secp256k1_fe *)
                     ((ulong)(0xfL << (-(char)iVar183 & 0x3fU)) >> (-(char)iVar183 & 0x3fU));
          uVar176 = -(iVar190 * ((iVar198 * 2 + 2U & 8) + iVar198)) & (uint)psVar191;
          psVar180 = psVar192;
          psVar189 = psVar199;
          psVar192 = psVar195;
          psVar199 = psVar197;
          xd = psVar202;
LAB_0015373f:
          uVar177 = (ulong)uVar176;
          puVar196 = (uint64_t *)((long)psVar199->n + uVar177 * (long)psVar189);
          psVar195 = (secp256k1_fe *)((long)psVar192->n + (long)psVar201 * uVar177);
          psVar192 = (secp256k1_fe *)((long)psVar180->n + uVar177 * (long)psVar179);
          psVar199 = psVar189;
          psVar202 = xd;
          if (((ulong)puVar196 & (ulong)psVar191) != 0) {
LAB_00153964:
            psStack_250 = (secp256k1_fe *)0x153969;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00153969:
            psStack_250 = (secp256k1_fe *)0x15396e;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_0015396e:
            psStack_250 = (secp256k1_fe *)0x153973;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar187 = psVar191;
            unaff_R12 = psVar192;
            psVar200 = psVar201;
            goto LAB_00153973;
          }
        }
        a = SUB168(SEXT816((long)psVar179) * SEXT816((long)psVar195),8);
        lVar181 = (long)psVar201 * (long)psVar192 - (long)psVar179 * (long)psVar195;
        uVar177 = (ulong)((ulong)((long)psVar201 * (long)psVar192) <
                         (ulong)((long)psVar179 * (long)psVar195));
        uVar184 = SUB168(SEXT816((long)psVar201) * SEXT816((long)psVar192),8) - (long)a;
        xd = (secp256k1_fe *)auStack_238;
        sStack_1d0.u = (int64_t)psVar201;
        sStack_1d0.v = (int64_t)psVar179;
        sStack_1d0.q = (int64_t)psVar195;
        sStack_1d0.r = (int64_t)psVar192;
        if ((uVar184 - uVar177 != -1 || lVar181 != -0x4000000000000000) &&
           (lVar181 != 0x4000000000000000 || uVar184 != uVar177)) goto LAB_001539a5;
        unaff_R12 = (secp256k1_fe *)auStack_1f8;
        iVar190 = (int)psVar200;
        psStack_250 = (secp256k1_fe *)0x1537ed;
        a = unaff_R12;
        iVar175 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar190,
                             (secp256k1_modinv64_signed62 *)auStack_238._40_8_,0);
        if (iVar175 < 1) {
LAB_00153973:
          psStack_250 = (secp256k1_fe *)0x153978;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00153978:
          psStack_250 = (secp256k1_fe *)0x15397d;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_0015397d:
          psStack_250 = (secp256k1_fe *)0x153982;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00153982:
          psStack_250 = (secp256k1_fe *)0x153987;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00153987;
        }
        psStack_250 = (secp256k1_fe *)0x153808;
        a = unaff_R12;
        iVar175 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar190,
                             (secp256k1_modinv64_signed62 *)psVar187,1);
        if (0 < iVar175) goto LAB_00153978;
        psStack_250 = (secp256k1_fe *)0x153820;
        a = xd;
        iVar175 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)xd,iVar190,
                             (secp256k1_modinv64_signed62 *)psVar187,0);
        if (iVar175 < 1) goto LAB_0015397d;
        psStack_250 = (secp256k1_fe *)0x15383b;
        a = xd;
        iVar175 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)xd,iVar190,
                             (secp256k1_modinv64_signed62 *)psVar187,1);
        if (-1 < iVar175) goto LAB_00153982;
        psStack_250 = (secp256k1_fe *)0x153856;
        secp256k1_modinv64_update_fg_62_var
                  (iVar190,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)xd,&sStack_1d0);
        if (auStack_1f8._0_8_ == 1) {
          if (1 < iVar190) {
            psVar191 = (secp256k1_fe *)0x1;
            uVar177 = 0;
            do {
              uVar177 = uVar177 | *(ulong *)(auStack_1f8 + (long)psVar191 * 8);
              psVar191 = (secp256k1_fe *)((long)psVar191->n + 1);
            } while (psVar200 != psVar191);
            if (uVar177 != 0) goto LAB_00153888;
          }
          uStack_240._4_4_ = 1 - (uVar176 * 2 & 2);
          bVar1 = false;
        }
        else {
LAB_00153888:
          lVar181 = (long)iVar190;
          if ((-1 < lVar181 + -2 && (&psStack_200)[lVar181] == (secp256k1_fe *)0x0) &&
              (&uStack_240)[lVar181] == 0) {
            psVar200 = (secp256k1_fe *)(ulong)(iVar190 - 1);
          }
          psStack_250 = (secp256k1_fe *)0x1538b5;
          iVar190 = (int)psVar200;
          a = unaff_R12;
          iVar175 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)unaff_R12,iVar190,
                               (secp256k1_modinv64_signed62 *)psVar187,0);
          if (iVar175 < 1) goto LAB_0015398c;
          psStack_250 = (secp256k1_fe *)0x1538d0;
          a = unaff_R12;
          iVar175 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)unaff_R12,iVar190,
                               (secp256k1_modinv64_signed62 *)psVar187,1);
          if (0 < iVar175) goto LAB_00153991;
          psStack_250 = (secp256k1_fe *)0x1538e8;
          a = xd;
          iVar175 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)xd,iVar190,
                               (secp256k1_modinv64_signed62 *)psVar187,0);
          if (iVar175 < 1) goto LAB_00153996;
          psStack_250 = (secp256k1_fe *)0x153903;
          a = xd;
          iVar175 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)xd,iVar190,
                               (secp256k1_modinv64_signed62 *)psVar187,1);
          bVar1 = true;
          if (-1 < iVar175) goto LAB_0015399b;
        }
        if (!bVar1) {
          return uStack_240._4_4_;
        }
        uVar176 = (int)uStack_208 + 1;
        uStack_208 = (ulong)uVar176;
        psVar191 = psVar187;
        xd = psVar202;
        if (uVar176 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_250 = (secp256k1_fe *)0x1539a5;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_001539a5:
  psStack_250 = (secp256k1_fe *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_2d8 = (secp256k1_fe *)0x1539c0;
  psVar200 = a;
  psStack_278 = psVar191;
  psStack_270 = psVar192;
  uStack_268 = unaff_R13;
  psStack_260 = psVar201;
  psStack_258 = psVar202;
  psStack_250 = xd;
  secp256k1_fe_verify(a);
  if (a->magnitude < 9) {
    uVar177 = a->n[0];
    uVar184 = a->n[1];
    uVar193 = a->n[2];
    uVar178 = a->n[3];
    uVar185 = a->n[4];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar177 * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar178;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar184 * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar193;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar185;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar185;
    uVar186 = SUB168(auVar64 * auVar132,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar186 & 0xfffffffffffff;
    auVar2 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
    uVar188 = auVar2._0_8_;
    uStack_2b0 = uVar188 & 0xfffffffffffff;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar188 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar185 = uVar185 * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar177;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar185;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar184 * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar178;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar193;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar193;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar186 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
    auVar2 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
             auVar69 * ZEXT816(0x1000003d10);
    uStack_2b8 = auVar2._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uStack_2b8 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_2c0 = (uStack_2b8 & 0xfffffffffffff) >> 0x30;
    uStack_2b8 = uStack_2b8 & 0xffffffffffff;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar177;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar177;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar184;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar185;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar193 * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar178;
    auVar2 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
    uVar186 = auVar2._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (uVar186 & 0xfffffffffffff) << 4 | uStack_2c0;
    auVar2 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
    uVar186 = auVar2._0_8_;
    sStack_2a8.n[0] = uVar186 & 0xfffffffffffff;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar177 * 2;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar184;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar193;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar185;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar178;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar178;
    auVar3 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
    uVar186 = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar186 & 0xfffffffffffff;
    auVar2 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
    uVar188 = auVar2._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar186 >> 0x34 | auVar3._8_8_ << 0xc;
    sStack_2a8.n[1] = uVar188 & 0xfffffffffffff;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar188 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar177 * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar193;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar184;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar184;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar178;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar185;
    auVar172 = auVar79 * auVar145 + auVar172;
    uVar177 = auVar172._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar177 & 0xfffffffffffff;
    auVar2 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
    uVar184 = auVar2._0_8_;
    sStack_2a8.n[2] = uVar184 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (uVar184 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_2b0;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar177 >> 0x34 | auVar172._8_8_ << 0xc;
    auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
    uVar177 = auVar173._0_8_;
    sStack_2a8.n[3] = uVar177 & 0xfffffffffffff;
    sStack_2a8.n[4] = (uVar177 >> 0x34 | auVar173._8_8_ << 0xc) + uStack_2b8;
    sStack_2a8.magnitude = 1;
    sStack_2a8.normalized = 0;
    psStack_2d8 = (secp256k1_fe *)0x153c0c;
    psStack_2c8 = a;
    secp256k1_fe_verify(&sStack_2a8);
    psStack_2d8 = (secp256k1_fe *)0x153c1c;
    secp256k1_fe_mul(&sStack_2a8,&sStack_2a8,psStack_2c8);
    psStack_2d8 = (secp256k1_fe *)0x153c24;
    secp256k1_fe_verify(&sStack_2a8);
    sStack_2a8.n[0] = sStack_2a8.n[0] + 7;
    sStack_2a8.normalized = 0;
    sStack_2a8.magnitude = sStack_2a8.magnitude + 1;
    psStack_2d8 = (secp256k1_fe *)0x153c3b;
    secp256k1_fe_verify(&sStack_2a8);
    psStack_2d8 = (secp256k1_fe *)0x153c43;
    iVar175 = secp256k1_fe_is_square_var(&sStack_2a8);
    return iVar175;
  }
  psStack_2d8 = (secp256k1_fe *)random_fe_test;
  secp256k1_ge_x_on_curve_var_cold_1();
  psStack_300 = a;
  psStack_2f8 = psVar192;
  uStack_2f0 = unaff_R13;
  psStack_2e8 = psVar201;
  psStack_2e0 = psVar202;
  psStack_2d8 = xd;
  do {
    secp256k1_testrand_bytes_test(auStack_328,0x20);
    secp256k1_fe_impl_set_b32_mod(psVar200,auStack_328);
    uVar177 = psVar200->n[4] ^ 0xffffffffffff;
    bVar174 = (psVar200->n[2] & psVar200->n[3] & psVar200->n[1]) == 0xfffffffffffff;
    bVar203 = bVar174 && uVar177 == 0;
    iVar175 = (int)CONCAT71((int7)(uVar177 >> 8),bVar203);
    bVar1 = 0xffffefffffc2e < psVar200->n[0];
    if (bVar1 && (bVar174 && uVar177 == 0)) {
      psVar200->magnitude = -1;
    }
    else {
      psVar200->magnitude = 1;
      psVar200->normalized = 1;
      secp256k1_fe_verify(psVar200);
      iVar175 = extraout_EAX;
    }
  } while (bVar1 && bVar203);
  return iVar175;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
#ifdef VERIFY
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));
#endif
     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}